

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.hpp
# Opt level: O3

void __thiscall ear::PolarSpeakerPosition::~PolarSpeakerPosition(PolarSpeakerPosition *this)

{
  type tVar1;
  type tVar2;
  
  if ((this->screenEdgeLock).vertical.super_type.m_initialized == true) {
    tVar2 = (this->screenEdgeLock).vertical.super_type.m_storage.dummy_.aligner_;
    tVar1 = (type)((long)&(this->screenEdgeLock).vertical.super_type.m_storage.dummy_ + 0x10);
    if (tVar2 != tVar1) {
      operator_delete((void *)tVar2,*(long *)tVar1 + 1);
    }
    (this->screenEdgeLock).vertical.super_type.m_initialized = false;
  }
  if ((this->screenEdgeLock).horizontal.super_type.m_initialized == true) {
    tVar2 = (this->screenEdgeLock).horizontal.super_type.m_storage.dummy_.aligner_;
    tVar1 = (type)((long)&(this->screenEdgeLock).horizontal.super_type.m_storage.dummy_ + 0x10);
    if (tVar2 != tVar1) {
      operator_delete((void *)tVar2,*(long *)tVar1 + 1);
    }
    (this->screenEdgeLock).horizontal.super_type.m_initialized = false;
  }
  return;
}

Assistant:

struct EAR_EXPORT PolarSpeakerPosition {
    PolarSpeakerPosition(double az = 0.0, double el = 0.0, double dist = 1.0)
        : azimuth(az), elevation(el), distance(dist){};
    double azimuth;
    boost::optional<double> azimuthMin;
    boost::optional<double> azimuthMax;
    double elevation;
    boost::optional<double> elevationMin;
    boost::optional<double> elevationMax;
    double distance;
    boost::optional<double> distanceMin;
    boost::optional<double> distanceMax;
    ScreenEdgeLock screenEdgeLock;
  }